

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Array<String>::~Array(Array<String> *this)

{
  String *pSVar1;
  String *i;
  String *pSVar2;
  
  pSVar2 = (this->_begin).item;
  if (pSVar2 != (String *)0x0) {
    pSVar1 = (this->_end).item;
    for (; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
      String::~String(pSVar2);
    }
    pSVar2 = (this->_begin).item;
    if (pSVar2 != (String *)0x0) {
      operator_delete__(pSVar2);
      return;
    }
  }
  return;
}

Assistant:

~Array()
  {
    if(_begin.item)
    {
      for(T* i = _begin.item, * end = _end.item; i != end; ++i)
        i->~T();
      delete[] (char*)_begin.item;
    }
  }